

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullShape.cpp
# Opt level: O3

void __thiscall
cbtConvexHullShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (cbtConvexHullShape *this,cbtVector3 *vectors,cbtVector3 *supportVerticesOut,
          int numVectors)

{
  float fVar1;
  ulong uVar2;
  cbtVector3 *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  cbtScalar *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  float fVar21;
  
  if (0 < numVectors) {
    auVar20._8_4_ = 0xdd5e0b6b;
    auVar20._0_8_ = 0xdd5e0b6bdd5e0b6b;
    auVar20._12_4_ = 0xdd5e0b6b;
    auVar20._16_4_ = 0xdd5e0b6b;
    auVar20._20_4_ = 0xdd5e0b6b;
    auVar20._24_4_ = 0xdd5e0b6b;
    auVar20._28_4_ = 0xdd5e0b6b;
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar13 = vpbroadcastq_avx512f(ZEXT816(0x10));
    uVar7 = (ulong)(numVectors + 0xfU & 0xfffffff0);
    auVar14 = vpbroadcastq_avx512f();
    do {
      uVar4 = vpcmpuq_avx512f(auVar11,auVar14,2);
      auVar15 = vpsllq_avx512f(auVar11,4);
      uVar5 = vpcmpuq_avx512f(auVar12,auVar14,2);
      auVar16 = vpsllq_avx512f(auVar12,4);
      auVar12 = vpaddq_avx512f(auVar12,auVar13);
      auVar11 = vpaddq_avx512f(auVar11,auVar13);
      uVar7 = uVar7 - 0x10;
      vscatterqps_avx512f(ZEXT864(supportVerticesOut) + ZEXT864(0xc) + auVar16,uVar5,auVar20);
      vscatterqps_avx512f(ZEXT864(supportVerticesOut) + ZEXT864(0xc) + auVar15,uVar4,auVar20);
    } while (uVar7 != 0);
    if (0 < numVectors) {
      uVar7 = 0;
      do {
        uVar8 = (ulong)(this->m_unscaledPoints).m_size;
        if ((long)uVar8 < 1) {
          supportVerticesOut[uVar7].m_floats[3] = -1e+18;
        }
        else {
          uVar2 = *(ulong *)&(this->super_cbtPolyhedralConvexAabbCachingShape).
                             super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                             super_cbtConvexShape.super_cbtCollisionShape.field_0x1c;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar2;
          pcVar3 = (this->m_unscaledPoints).m_data;
          uVar9 = 0xffffffff;
          uVar10 = 0;
          auVar17 = SUB6416(ZEXT464(0xff7fffff),0);
          pcVar6 = pcVar3->m_floats + 2;
          auVar18 = vmovshdup_avx(auVar18);
          fVar1 = *(float *)&(this->super_cbtPolyhedralConvexAabbCachingShape).
                             super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.field_0x24;
          do {
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * vectors[uVar7].m_floats[1] *
                                                    pcVar6[-1])),
                                      ZEXT416((uint)((float)uVar2 * vectors[uVar7].m_floats[0])),
                                      ZEXT416((uint)((cbtVector3 *)(pcVar6 + -2))->m_floats[0]));
            auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)(fVar1 * vectors[uVar7].m_floats[2])),
                                      ZEXT416((uint)*pcVar6));
            fVar21 = auVar17._0_4_;
            auVar17 = vmaxss_avx(auVar19,auVar17);
            if (fVar21 < auVar19._0_4_) {
              uVar9 = uVar10 & 0xffffffff;
            }
            uVar10 = uVar10 + 1;
            pcVar6 = pcVar6 + 4;
          } while (uVar8 != uVar10);
          auVar19._0_4_ = (float)*(undefined8 *)pcVar3[(int)uVar9].m_floats * (float)uVar2;
          auVar19._4_4_ =
               (float)((ulong)*(undefined8 *)pcVar3[(int)uVar9].m_floats >> 0x20) *
               (float)(uVar2 >> 0x20);
          auVar19._8_8_ = 0;
          auVar18 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar1 * pcVar3[(int)uVar9].m_floats[2])),
                                  0x28);
          *(undefined1 (*) [16])supportVerticesOut[uVar7].m_floats = auVar18;
          supportVerticesOut[uVar7].m_floats[3] = auVar17._0_4_;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != (uint)numVectors);
    }
  }
  return;
}

Assistant:

void cbtConvexHullShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const cbtVector3* vectors, cbtVector3* supportVerticesOut, int numVectors) const
{
	cbtScalar newDot;
	//use 'w' component of supportVerticesOut?
	{
		for (int i = 0; i < numVectors; i++)
		{
			supportVerticesOut[i][3] = cbtScalar(-BT_LARGE_FLOAT);
		}
	}

	for (int j = 0; j < numVectors; j++)
	{
		cbtVector3 vec = vectors[j] * m_localScaling;  // dot(a*b,c) = dot(a,b*c)
		if (0 < m_unscaledPoints.size())
		{
			int i = (int)vec.maxDot(&m_unscaledPoints[0], m_unscaledPoints.size(), newDot);
			supportVerticesOut[j] = getScaledPoint(i);
			supportVerticesOut[j][3] = newDot;
		}
		else
			supportVerticesOut[j][3] = -BT_LARGE_FLOAT;
	}
}